

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O2

int cmsysProcess_WaitForExit(cmsysProcess *cp,double *userTimeout)

{
  char *__s;
  uint uVar1;
  int iVar2;
  undefined8 uVar3;
  uint uVar4;
  
  if (cp == (cmsysProcess *)0x0) {
    return 1;
  }
  if (cp->State != 3) {
    return 1;
  }
  while (iVar2 = cmsysProcess_WaitForData(cp,(char **)0x0,(int *)0x0,userTimeout), 0 < iVar2) {
    if (iVar2 == 0xff) {
      return 0;
    }
  }
  if (cp->State == 1) goto LAB_001035b0;
  if (cp->SelectError != 0) {
    kwsysProcessCleanup(cp,0);
    cp->State = 1;
    return 1;
  }
  uVar1 = cp->CommandExitCodes[(long)cp->NumberOfCommands + -1];
  if (cp->Killed != 0) {
    cp->State = 6;
    goto LAB_001035b0;
  }
  if (cp->TimeoutExpired != 0) {
    cp->State = 5;
    goto LAB_001035b0;
  }
  uVar4 = uVar1 & 0x7f;
  if (uVar4 == 0) {
    cp->State = 4;
    cp->ExitException = 0;
    cp->ExitCode = uVar1;
    cp->ExitValue = uVar1 >> 8 & 0xff;
    goto LAB_001035b0;
  }
  if ((int)(uVar4 * 0x1000000 + 0x1000000) < 0x2000000) {
    builtin_strncpy(cp->ErrorMessage,"Error getting child return code.",0x21);
    cp->State = 1;
    goto LAB_001035b0;
  }
  cp->State = 2;
  cp->ExitCode = uVar1;
  __s = cp->ExitExceptionString;
  switch(uVar4) {
  case 1:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGHUP",7);
    goto LAB_001035b0;
  case 2:
    cp->ExitException = 3;
    builtin_strncpy(cp->ExitExceptionString + 7,"terrupt",8);
    uVar3 = 0x746e692072657355;
    goto LAB_001039c3;
  case 3:
    cp->ExitException = 5;
    uVar3 = 0x54495551474953;
    break;
  case 4:
    cp->ExitException = 2;
    builtin_strncpy(__s,"Illegal instruction",0x14);
    goto LAB_001035b0;
  case 5:
    cp->ExitException = 5;
    uVar3 = 0x50415254474953;
    break;
  case 6:
    cp->ExitException = 5;
    builtin_strncpy(cp->ExitExceptionString + 6,"aborted",8);
    uVar3 = 0x626120646c696843;
    goto LAB_001039c3;
  case 7:
    cp->ExitException = 1;
    builtin_strncpy(__s,"Bus error",10);
    goto LAB_001035b0;
  case 8:
    cp->ExitException = 4;
    builtin_strncpy(__s,"Floating-point exception",0x19);
    goto LAB_001035b0;
  case 9:
    cp->ExitException = 5;
    builtin_strncpy(cp->ExitExceptionString + 5," killed",8);
    uVar3 = 0x696b20646c696843;
LAB_001039c3:
    *(undefined8 *)__s = uVar3;
    goto LAB_001035b0;
  case 10:
    cp->ExitException = 5;
    uVar3 = 0x31525355474953;
    break;
  case 0xb:
    cp->ExitException = 1;
    builtin_strncpy(__s,"Segmentation fault",0x13);
    goto LAB_001035b0;
  case 0xc:
    cp->ExitException = 5;
    uVar3 = 0x32525355474953;
    break;
  case 0xd:
    cp->ExitException = 5;
    uVar3 = 0x45504950474953;
    break;
  case 0xe:
    cp->ExitException = 5;
    uVar3 = 0x4d524c41474953;
    break;
  case 0xf:
    cp->ExitException = 5;
    builtin_strncpy(__s,"Child terminated",0x11);
    goto LAB_001035b0;
  case 0x10:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGSTKFLT",10);
    goto LAB_001035b0;
  case 0x11:
    cp->ExitException = 5;
    uVar3 = 0x444c4843474953;
    break;
  case 0x12:
    cp->ExitException = 5;
    uVar3 = 0x544e4f43474953;
    break;
  case 0x13:
    cp->ExitException = 5;
    uVar3 = 0x504f5453474953;
    break;
  case 0x14:
    cp->ExitException = 5;
    uVar3 = 0x50545354474953;
    break;
  case 0x15:
    cp->ExitException = 5;
    uVar3 = 0x4e495454474953;
    break;
  case 0x16:
    cp->ExitException = 5;
    uVar3 = 0x554f5454474953;
    break;
  case 0x17:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGURG",7);
    goto LAB_001035b0;
  case 0x18:
    cp->ExitException = 5;
    uVar3 = 0x55504358474953;
    break;
  case 0x19:
    cp->ExitException = 5;
    uVar3 = 0x5a534658474953;
    break;
  case 0x1a:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGVTALRM",10);
    goto LAB_001035b0;
  case 0x1b:
    cp->ExitException = 5;
    uVar3 = 0x464f5250474953;
    break;
  case 0x1c:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGWINCH",9);
    goto LAB_001035b0;
  case 0x1d:
    cp->ExitException = 5;
    uVar3 = 0x4c4c4f50474953;
    break;
  case 0x1e:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGPWR",7);
    goto LAB_001035b0;
  case 0x1f:
    cp->ExitException = 5;
    builtin_strncpy(__s,"SIGSYS",7);
    goto LAB_001035b0;
  default:
    cp->ExitException = 5;
    sprintf(__s,"Signal %d");
    goto LAB_001035b0;
  }
  *(undefined8 *)cp->ExitExceptionString = uVar3;
LAB_001035b0:
  kwsysProcessCleanup(cp,0);
  return 1;
}

Assistant:

int kwsysProcess_WaitForExit(kwsysProcess* cp, double* userTimeout)
{
  int status = 0;
  int prPipe = 0;

  /* Make sure we are executing a process.  */
  if(!cp || cp->State != kwsysProcess_State_Executing)
    {
    return 1;
    }

  /* Wait for all the pipes to close.  Ignore all data.  */
  while((prPipe = kwsysProcess_WaitForData(cp, 0, 0, userTimeout)) > 0)
    {
    if(prPipe == kwsysProcess_Pipe_Timeout)
      {
      return 0;
      }
    }

  /* Check if there was an error in one of the waitpid calls.  */
  if(cp->State == kwsysProcess_State_Error)
    {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    return 1;
    }

  /* Check whether the child reported an error invoking the process.  */
  if(cp->SelectError)
    {
    /* The error message is already in its buffer.  Tell
       kwsysProcessCleanup to not create it.  */
    kwsysProcessCleanup(cp, 0);
    cp->State = kwsysProcess_State_Error;
    return 1;
    }

  /* Use the status of the last process in the pipeline.  */
  status = cp->CommandExitCodes[cp->NumberOfCommands-1];

  /* Determine the outcome.  */
  if(cp->Killed)
    {
    /* We killed the child.  */
    cp->State = kwsysProcess_State_Killed;
    }
  else if(cp->TimeoutExpired)
    {
    /* The timeout expired.  */
    cp->State = kwsysProcess_State_Expired;
    }
  else if(WIFEXITED(status))
    {
    /* The child exited normally.  */
    cp->State = kwsysProcess_State_Exited;
    cp->ExitException = kwsysProcess_Exception_None;
    cp->ExitCode = status;
    cp->ExitValue = (int)WEXITSTATUS(status);
    }
  else if(WIFSIGNALED(status))
    {
    /* The child received an unhandled signal.  */
    cp->State = kwsysProcess_State_Exception;
    cp->ExitCode = status;
    kwsysProcessSetExitException(cp, (int)WTERMSIG(status));
    }
  else
    {
    /* Error getting the child return code.  */
    strcpy(cp->ErrorMessage, "Error getting child return code.");
    cp->State = kwsysProcess_State_Error;
    }

  /* Normal cleanup.  */
  kwsysProcessCleanup(cp, 0);
  return 1;
}